

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLevelSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,Vec3 *coord,Vec4 *result)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int c;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  bool bVar21;
  TextureChannelClass TVar22;
  int iVar23;
  int iVar24;
  int x0;
  uint x1;
  uint y0;
  int y1;
  int z;
  int z_00;
  uint uVar25;
  ulong uVar26;
  int c_00;
  int iVar27;
  int c_01;
  Vec2 *fBounds;
  Vec4 *result_00;
  int iVar28;
  int iVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar39;
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int local_2f8;
  float local_2dc;
  float local_2d8;
  float local_268;
  Vec2 uBounds;
  Vec2 wBounds;
  Vec2 vBounds;
  ColorQuad quad0;
  ColorQuad local_158;
  Vec4 c1;
  Vec4 c0;
  float local_e8;
  float fStack_e4;
  BVec4 BStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar37 [16];
  
  if (filterMode == LINEAR) {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[0],
               coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&vBounds,sampler->normalizedCoords,(level->m_size).m_data[1],
               coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&wBounds,sampler->normalizedCoords,(level->m_size).m_data[2],
               coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
    fVar30 = floorf(uBounds.m_data[0] + -0.5);
    fVar31 = floorf(uBounds.m_data[1] + -0.5);
    fVar32 = floorf(vBounds.m_data[0] + -0.5);
    fVar33 = floorf(vBounds.m_data[1] + -0.5);
    fVar34 = floorf(wBounds.m_data[0] + -0.5);
    fVar35 = floorf(wBounds.m_data[1] + -0.5);
    iVar2 = (level->m_size).m_data[0];
    iVar3 = (level->m_size).m_data[1];
    iVar23 = (level->m_size).m_data[2];
    TVar22 = getTextureChannelClass((level->m_format).type);
    if (TVar22 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_2d8 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_2d8 = 0.0;
      if (TVar22 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        local_2d8 = computeBilinearSearchStepForUnorm(prec);
      }
    }
    if ((int)fVar34 <= (int)fVar35) {
      iVar24 = (int)fVar34;
      do {
        iVar27 = iVar24 + 1;
        if ((int)fVar32 <= (int)fVar33) {
          c = (int)fVar32;
          do {
            c_00 = c + 1;
            if ((int)fVar30 <= (int)fVar31) {
              iVar28 = (int)fVar30;
              do {
                x0 = TexVerifierUtil::wrap(sampler->wrapS,iVar28,iVar2);
                c_01 = iVar28 + 1;
                x1 = TexVerifierUtil::wrap(sampler->wrapS,c_01,iVar2);
                y0 = TexVerifierUtil::wrap(sampler->wrapT,c,iVar3);
                y1 = TexVerifierUtil::wrap(sampler->wrapT,c_00,iVar3);
                z = TexVerifierUtil::wrap(sampler->wrapR,iVar24,iVar23);
                z_00 = TexVerifierUtil::wrap(sampler->wrapR,iVar27,iVar23);
                fVar34 = (uBounds.m_data[0] + -0.5) - (float)iVar28;
                fVar47 = (uBounds.m_data[1] + -0.5) - (float)iVar28;
                iVar28 = -(uint)(1.0 < fVar34);
                iVar29 = -(uint)(1.0 < fVar47);
                auVar38._4_4_ = iVar29;
                auVar38._0_4_ = iVar28;
                auVar38._8_4_ = iVar29;
                auVar38._12_4_ = iVar29;
                auVar37._8_8_ = auVar38._8_8_;
                auVar37._4_4_ = iVar28;
                auVar37._0_4_ = iVar28;
                uVar25 = movmskpd(z_00,auVar37);
                local_268 = 1.0;
                if ((uVar25 & 1) == 0) {
                  local_268 = fVar34;
                }
                fVar41 = 1.0;
                if ((uVar25 & 2) == 0) {
                  fVar41 = fVar47;
                }
                fVar39 = (vBounds.m_data[0] + -0.5) - (float)c;
                fVar40 = (vBounds.m_data[1] + -0.5) - (float)c;
                auVar46._4_4_ = -(uint)((wBounds.m_data[1] + -0.5) - (float)iVar24 < 0.0);
                auVar46._0_4_ = -(uint)((wBounds.m_data[0] + -0.5) - (float)iVar24 < 0.0);
                auVar46._8_4_ = -(uint)(fVar39 < 0.0);
                auVar46._12_4_ = -(uint)(fVar40 < 0.0);
                uVar25 = movmskps(uVar25,auVar46);
                local_2dc = 0.0;
                if (((uVar25 & 4) == 0) && (local_2dc = 1.0, fVar39 <= 1.0)) {
                  local_2dc = fVar39;
                }
                fVar39 = 0.0;
                if (((uVar25 & 8) == 0) && (fVar39 = 1.0, fVar40 <= 1.0)) {
                  fVar39 = fVar40;
                }
                quad0.p11.m_data[0] = 0.0;
                quad0.p11.m_data[1] = 0.0;
                quad0.p11.m_data[2] = 0.0;
                quad0.p11.m_data[3] = 0.0;
                quad0.p10.m_data[0] = 0.0;
                quad0.p10.m_data[1] = 0.0;
                quad0.p10.m_data[2] = 0.0;
                quad0.p10.m_data[3] = 0.0;
                quad0.p01.m_data[0] = 0.0;
                quad0.p01.m_data[1] = 0.0;
                quad0.p01.m_data[2] = 0.0;
                quad0.p01.m_data[3] = 0.0;
                quad0.p00.m_data[0] = 0.0;
                quad0.p00.m_data[1] = 0.0;
                quad0.p00.m_data[2] = 0.0;
                quad0.p00.m_data[3] = 0.0;
                local_158.p11.m_data[0] = 0.0;
                local_158.p11.m_data[1] = 0.0;
                local_158.p11.m_data[2] = 0.0;
                local_158.p11.m_data[3] = 0.0;
                local_158.p10.m_data[0] = 0.0;
                local_158.p10.m_data[1] = 0.0;
                local_158.p10.m_data[2] = 0.0;
                local_158.p10.m_data[3] = 0.0;
                local_158.p01.m_data[0] = 0.0;
                local_158.p01.m_data[1] = 0.0;
                local_158.p01.m_data[2] = 0.0;
                local_158.p01.m_data[3] = 0.0;
                local_158.p00.m_data[0] = 0.0;
                local_158.p00.m_data[1] = 0.0;
                local_158.p00.m_data[2] = 0.0;
                local_158.p00.m_data[3] = 0.0;
                lookupQuad(&quad0,level,sampler,x0,x1,y0,y1,z);
                fBounds = (Vec2 *)(ulong)x1;
                result_00 = (Vec4 *)(ulong)y0;
                lookupQuad(&local_158,level,sampler,x0,x1,y0,y1,z_00);
                if (TVar22 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                  fVar40 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
                  fVar36 = computeBilinearSearchStepFromFloatQuad(prec,&local_158);
                  local_2d8 = (float)(~-(uint)(fVar40 <= fVar36) & (uint)fVar36 |
                                     (uint)fVar40 & -(uint)(fVar40 <= fVar36));
                }
                bVar21 = isInColorBounds(prec,&quad0,&local_158,result);
                uVar20 = local_158.p11.m_data._8_8_;
                uVar19 = local_158.p11.m_data._0_8_;
                uVar18 = local_158.p10.m_data._8_8_;
                uVar17 = local_158.p10.m_data._0_8_;
                uVar16 = local_158.p01.m_data._8_8_;
                uVar15 = local_158.p01.m_data._0_8_;
                uVar14 = local_158.p00.m_data._8_8_;
                uVar13 = local_158.p00.m_data._0_8_;
                uVar12 = quad0.p11.m_data._8_8_;
                uVar11 = quad0.p11.m_data._0_8_;
                uVar10 = quad0.p10.m_data._8_8_;
                uVar9 = quad0.p10.m_data._0_8_;
                uVar8 = quad0.p01.m_data._8_8_;
                uVar7 = quad0.p01.m_data._0_8_;
                uVar6 = quad0.p00.m_data._8_8_;
                uVar5 = quad0.p00.m_data._0_8_;
                if (bVar21) {
                  local_268 = (float)(~-(uint)(fVar34 < 0.0) & (uint)local_268);
                  fVar41 = (float)(~-(uint)(fVar47 < 0.0) & (uint)fVar41);
                  if (local_268 < fVar41 + local_2d8) {
                    do {
                      if (local_2dc < fVar39 + local_2d8) {
                        fVar40 = (float)(~-(uint)(local_268 <= fVar41) & (uint)fVar41 |
                                        -(uint)(local_268 <= fVar41) & (uint)local_268);
                        fVar47 = 1.0 - fVar40;
                        local_78 = (float)uVar5;
                        fStack_74 = SUB84(uVar5,4);
                        fStack_70 = (float)uVar6;
                        fStack_6c = SUB84(uVar6,4);
                        local_98 = (float)uVar9;
                        fStack_94 = SUB84(uVar9,4);
                        fStack_90 = (float)uVar10;
                        fStack_8c = SUB84(uVar10,4);
                        local_88 = (float)uVar7;
                        fStack_84 = SUB84(uVar7,4);
                        fStack_80 = (float)uVar8;
                        fStack_7c = SUB84(uVar8,4);
                        local_a8 = (float)uVar11;
                        fStack_a4 = SUB84(uVar11,4);
                        fStack_a0 = (float)uVar12;
                        fStack_9c = SUB84(uVar12,4);
                        local_b8 = (float)uVar13;
                        fStack_b4 = SUB84(uVar13,4);
                        fStack_b0 = (float)uVar14;
                        fStack_ac = SUB84(uVar14,4);
                        local_d8 = (float)uVar17;
                        fStack_d4 = SUB84(uVar17,4);
                        fStack_d0 = (float)uVar18;
                        fStack_cc = SUB84(uVar18,4);
                        local_c8 = (float)uVar15;
                        fStack_c4 = SUB84(uVar15,4);
                        fStack_c0 = (float)uVar16;
                        fStack_bc = SUB84(uVar16,4);
                        local_e8 = (float)uVar19;
                        fStack_e4 = SUB84(uVar19,4);
                        BStack_e0.m_data = SUB84(uVar20,0);
                        fStack_dc = SUB84(uVar20,4);
                        fVar34 = local_2dc;
                        do {
                          fVar36 = (float)(~-(uint)(fVar34 <= fVar39) & (uint)fVar39 |
                                          -(uint)(fVar34 <= fVar39) & (uint)fVar34);
                          fVar42 = 1.0 - fVar36;
                          c0.m_data[0] = fVar36 * fVar40 * local_a8 +
                                         fVar36 * fVar47 * local_88 +
                                         fVar42 * fVar40 * local_98 + fVar42 * fVar47 * local_78;
                          c0.m_data[1] = fVar36 * fVar40 * fStack_a4 +
                                         fVar36 * fVar47 * fStack_84 +
                                         fVar42 * fVar40 * fStack_94 + fVar42 * fVar47 * fStack_74;
                          c0.m_data[2] = fVar36 * fVar40 * fStack_a0 +
                                         fVar36 * fVar47 * fStack_80 +
                                         fVar42 * fVar40 * fStack_90 + fVar42 * fVar47 * fStack_70;
                          c0.m_data[3] = fVar36 * fVar40 * fStack_9c +
                                         fVar36 * fVar47 * fStack_7c +
                                         fVar42 * fVar40 * fStack_8c + fVar42 * fVar47 * fStack_6c;
                          c1.m_data[0] = fVar36 * fVar40 * local_e8 +
                                         fVar36 * fVar47 * local_c8 +
                                         fVar42 * fVar40 * local_d8 + fVar42 * fVar47 * local_b8;
                          c1.m_data[1] = fVar36 * fVar40 * fStack_e4 +
                                         fVar36 * fVar47 * fStack_c4 +
                                         fVar42 * fVar40 * fStack_d4 + fVar42 * fVar47 * fStack_b4;
                          c1.m_data[2] = fVar36 * fVar40 * (float)BStack_e0.m_data +
                                         fVar36 * fVar47 * fStack_c0 +
                                         fVar42 * fVar40 * fStack_d0 + fVar42 * fVar47 * fStack_b0;
                          c1.m_data[3] = fVar36 * fVar40 * fStack_dc +
                                         fVar36 * fVar47 * fStack_bc +
                                         fVar42 * fVar40 * fStack_cc + fVar42 * fVar47 * fStack_ac;
                          bVar21 = isLinearRangeValid((tcu *)prec,(LookupPrecision *)&c0,&c1,result,
                                                      fBounds,result_00);
                          if (bVar21) {
                            return true;
                          }
                          fVar34 = fVar34 + local_2d8;
                        } while (fVar34 < fVar39 + local_2d8);
                      }
                      local_268 = local_268 + local_2d8;
                    } while (local_268 < fVar41 + local_2d8);
                  }
                }
                iVar28 = c_01;
              } while (c_01 <= (int)fVar31);
            }
            c = c_00;
          } while (c_00 <= (int)fVar33);
        }
        iVar24 = iVar27;
      } while (iVar27 <= (int)fVar35);
    }
  }
  else {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&c0,sampler->normalizedCoords,(level->m_size).m_data[0],
               coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&c1,sampler->normalizedCoords,(level->m_size).m_data[1],
               coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[2],
               coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
    fVar30 = floorf(c0.m_data[0]);
    fVar31 = floorf(c0.m_data[1]);
    fVar32 = floorf(c1.m_data[0]);
    fVar33 = floorf(c1.m_data[1]);
    fVar34 = floorf(uBounds.m_data[0]);
    local_2f8 = (int)fVar34;
    fVar34 = floorf(uBounds.m_data[1]);
    if (local_2f8 <= (int)fVar34) {
      iVar2 = (int)fVar32;
      do {
        for (; iVar3 = (int)fVar30, iVar2 <= (int)fVar33; iVar2 = iVar2 + 1) {
          for (; iVar3 <= (int)fVar31; iVar3 = iVar3 + 1) {
            iVar23 = TexVerifierUtil::wrap(sampler->wrapS,iVar3,(level->m_size).m_data[0]);
            iVar24 = TexVerifierUtil::wrap(sampler->wrapT,iVar2,(level->m_size).m_data[1]);
            iVar27 = TexVerifierUtil::wrap(sampler->wrapR,local_2f8,(level->m_size).m_data[2]);
            if (((((iVar23 < 0) || ((level->m_size).m_data[0] <= iVar23)) || (iVar24 < 0)) ||
                (((level->m_size).m_data[1] <= iVar24 || (iVar27 < 0)))) ||
               ((level->m_size).m_data[2] <= iVar27)) {
              sampleTextureBorder<float>((TextureFormat *)&local_158,(Sampler *)level);
            }
            else {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&quad0,(int)level,iVar23,iVar24);
              bVar21 = isSRGB(level->m_format);
              if (bVar21) {
                sRGBToLinear((tcu *)&local_158,&quad0.p00);
              }
              else {
                local_158.p00.m_data[0] = quad0.p00.m_data[0];
                local_158.p00.m_data[1] = quad0.p00.m_data[1];
                local_158.p00.m_data[2] = quad0.p00.m_data[2];
                local_158.p00.m_data[3] = quad0.p00.m_data[3];
              }
            }
            auVar44._0_4_ = local_158.p00.m_data[0] - result->m_data[0];
            auVar44._4_4_ = local_158.p00.m_data[1] - result->m_data[1];
            auVar44._8_4_ = local_158.p00.m_data[2] - result->m_data[2];
            auVar44._12_4_ = local_158.p00.m_data[3] - result->m_data[3];
            uVar26 = CONCAT44(auVar44._4_4_,auVar44._0_4_);
            auVar43._0_8_ = uVar26 ^ 0x8000000080000000;
            auVar43._8_4_ = -auVar44._8_4_;
            auVar43._12_4_ = -auVar44._12_4_;
            auVar44 = maxps(auVar43,auVar44);
            auVar45._4_4_ = -(uint)(auVar44._4_4_ <= (prec->colorThreshold).m_data[1]);
            auVar45._0_4_ = -(uint)(auVar44._0_4_ <= (prec->colorThreshold).m_data[0]);
            auVar45._8_4_ = -(uint)(auVar44._8_4_ <= (prec->colorThreshold).m_data[2]);
            auVar45._12_4_ = -(uint)(auVar44._12_4_ <= (prec->colorThreshold).m_data[3]);
            auVar44 = packssdw(auVar45,auVar45);
            auVar44 = packsswb(auVar44,auVar44);
            fVar35 = (float)(*(uint *)(prec->colorMask).m_data ^ (uint)DAT_00ac4030 |
                            auVar44._0_4_ & (uint)DAT_00ac4030);
            quad0.p00.m_data[0] = fVar35;
            if (SUB41(fVar35,0) != '\0') {
              uVar26 = 0xffffffffffffffff;
              do {
                if (uVar26 == 2) {
                  return true;
                }
                uVar1 = uVar26 + 1;
                lVar4 = uVar26 + 2;
                uVar26 = uVar1;
              } while (*(char *)((long)quad0.p00.m_data + lVar4) != '\0');
              if (2 < uVar1) {
                return true;
              }
            }
          }
        }
        local_2f8 = local_2f8 + 1;
        iVar2 = (int)fVar32;
      } while (local_2f8 <= (int)fVar34);
    }
  }
  return false;
}

Assistant:

static bool isLevelSampleResultValid (const ConstPixelBufferAccess&		level,
									  const Sampler&					sampler,
									  const Sampler::FilterMode			filterMode,
									  const LookupPrecision&			prec,
									  const Vec3&						coord,
									  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
		return isLinearSampleResultValid(level, sampler, prec, coord, result);
	else
		return isNearestSampleResultValid(level, sampler, prec, coord, result);
}